

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O1

PersonHandle * __thiscall
mbc::Val::PersonHandle::changeAttr(PersonHandle *this,string *attribute,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Person *this_00;
  pointer pcVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
  *this_01;
  long lVar3;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *plVar4;
  int iVar5;
  _ValAtom *this_02;
  Str *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Node *p_Var7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
  local_78;
  string local_50;
  
  if (*(this->super_ValBase).is_vaild_ == true) {
    remove(this,(char *)attribute);
    this_00 = this->person_;
    pcVar2 = (attribute->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + attribute->_M_string_length);
    this_02 = Person::attr(this_00,&local_50);
    _ValAtom::set(this_02,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    Person::update_ID_(this->person_);
    this_01 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
               *)this->mb_->persons_;
    pSVar6 = Person::ID(this->person_);
    iVar5 = (*(pSVar6->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar6);
    paVar1 = &local_78.first.field_2;
    lVar3 = *(long *)CONCAT44(extraout_var,iVar5);
    local_78.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,lVar3,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar3);
    local_78.second = this->person_;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,mbc::Val::Person*>>(this_01,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.first._M_dataplus._M_p);
    }
    plVar4 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->mb_->order_;
    pSVar6 = Person::ID(this->person_);
    iVar5 = (*(pSVar6->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar6);
    p_Var7 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       (plVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var_00,iVar5));
    std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
    plVar4 = plVar4 + 0x10;
    *(long *)plVar4 = *(long *)plVar4 + 1;
    *(this->super_ValBase).is_vaild_ = true;
    MessageBook::save(this->mb_);
    reset_(this);
  }
  return this;
}

Assistant:

PersonHandle& PersonHandle::changeAttr(string attribute, string value) {
    if(*is_vaild_) {
        // remove self and then update deeply
        remove();
        person_ -> attr(attribute) -> set(value);
        person_ -> update_ID_();

        // after the person's ID is changed, update mb.
        mb_ -> persons_ -> insert(std::pair<string, Person*>(person_ -> ID().raw(), person_));
        mb_ -> order_ -> push_back(person_ -> ID().raw());
        *is_vaild_ = true;

        // save messagebook and reset self
        mb_ -> save();
        reset_();
    } else {
        ; // do nothing
    }
    return *this;
}